

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::SetFunctionIdSlotForNewPolymorphicCall
          (DynamicProfileInfo *this,ProfileId callSiteId,LocalFunctionId curFunctionId,
          SourceId curSourceId,FunctionBody *inliner)

{
  bool bVar1;
  int iVar2;
  CallSiteInfo **ppCVar3;
  PolymorphicCallSiteInfo *pPVar4;
  undefined4 extraout_var;
  char16 *pcVar5;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  uint local_2c;
  int i;
  FunctionBody *inliner_local;
  SourceId curSourceId_local;
  LocalFunctionId curFunctionId_local;
  ProfileId callSiteId_local;
  DynamicProfileInfo *this_local;
  
  local_2c = 0;
  while( true ) {
    if (3 < local_2c) {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
      if (bVar1) {
        iVar2 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        pcVar5 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)inliner,(wchar (*) [42])local_88)
        ;
        Output::Print(L"INLINING (Polymorphic): More than 4 functions at this call site \t callSiteId: %d\t calleeFunctionId: %d TopFunc %s (%s)\n"
                      ,(ulong)callSiteId,(ulong)curFunctionId,CONCAT44(extraout_var,iVar2),pcVar5);
        Output::Flush();
      }
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,PerfHintPhase);
      if (bVar1) {
        WritePerfHint(PolymorphicInilineCap,inliner,0xffffffff);
      }
      ResetPolymorphicCallSiteInfo(this,callSiteId,0xffffffff);
      return;
    }
    ppCVar3 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    pPVar4 = Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator->
                       ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
                        &(*ppCVar3)[callSiteId].u.functionData);
    if (pPVar4->functionIds[(int)local_2c] == curFunctionId) {
      ppCVar3 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      pPVar4 = Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator->
                         ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
                          &(*ppCVar3)[callSiteId].u.functionData);
      if (pPVar4->sourceIds[(int)local_2c] == curSourceId) {
        return;
      }
    }
    ppCVar3 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    pPVar4 = Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator->
                       ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
                        &(*ppCVar3)[callSiteId].u.functionData);
    if (pPVar4->functionIds[(int)local_2c] == 0xfffffffc) break;
    local_2c = local_2c + 1;
  }
  ppCVar3 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  pPVar4 = Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator->
                     ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
                      &(*ppCVar3)[callSiteId].u.functionData);
  pPVar4->functionIds[(int)local_2c] = curFunctionId;
  ppCVar3 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  pPVar4 = Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator->
                     ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
                      &(*ppCVar3)[callSiteId].u.functionData);
  pPVar4->sourceIds[(int)local_2c] = curSourceId;
  this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
  return;
}

Assistant:

void DynamicProfileInfo::SetFunctionIdSlotForNewPolymorphicCall(ProfileId callSiteId, Js::LocalFunctionId curFunctionId, Js::SourceId curSourceId, Js::FunctionBody *inliner)
    {
        for (int i = 0; i < maxPolymorphicInliningSize; i++)
        {
            if (callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->functionIds[i] == curFunctionId &&
                callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->sourceIds[i] == curSourceId)
            {
                // we have it already
                return;
            }
            else if (callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->functionIds[i] == CallSiteNoInfo)
            {
                callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->functionIds[i] = curFunctionId;
                callSiteInfo[callSiteId].u.polymorphicCallSiteInfo->sourceIds[i] = curSourceId;
                this->currentInlinerVersion++;
                return;
            }
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::PolymorphicInlinePhase))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

            Output::Print(_u("INLINING (Polymorphic): More than 4 functions at this call site \t callSiteId: %d\t calleeFunctionId: %d TopFunc %s (%s)\n"),
                callSiteId,
                curFunctionId,
                inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer)
                );
            Output::Flush();
        }
#endif

#ifdef PERF_HINT
        if (PHASE_TRACE1(Js::PerfHintPhase))
        {
            WritePerfHint(PerfHints::PolymorphicInilineCap, inliner);
        }
#endif

        // We reached the max allowed to inline, no point in continuing collecting the information. Reset and move on.
        ResetPolymorphicCallSiteInfo(callSiteId, CallSiteMixed);
    }